

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool array_container_is_subset_bitset(array_container_t *container1,bitset_container_t *container2)

{
  _Bool _Var1;
  int local_24;
  int i;
  bitset_container_t *container2_local;
  array_container_t *container1_local;
  
  if ((container2->cardinality == -1) || (container1->cardinality <= container2->cardinality)) {
    for (local_24 = 0; local_24 < container1->cardinality; local_24 = local_24 + 1) {
      _Var1 = bitset_container_contains(container2,container1->array[local_24]);
      if (!_Var1) {
        return false;
      }
    }
    container1_local._7_1_ = true;
  }
  else {
    container1_local._7_1_ = false;
  }
  return container1_local._7_1_;
}

Assistant:

bool array_container_is_subset_bitset(const array_container_t* container1,
                                      const bitset_container_t* container2) {
    if (container2->cardinality != BITSET_UNKNOWN_CARDINALITY) {
        if (container2->cardinality < container1->cardinality) {
            return false;
        }
    }
    for (int i = 0; i < container1->cardinality; ++i) {
        if (!bitset_container_contains(container2, container1->array[i])) {
            return false;
        }
    }
    return true;
}